

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_entry_free(mtree_entry_conflict *me)

{
  mtree_entry_conflict *me_local;
  
  archive_string_free(&me->parentdir);
  archive_string_free(&me->basename);
  archive_string_free(&me->pathname);
  archive_string_free(&me->symlink);
  archive_string_free(&me->uname);
  archive_string_free(&me->gname);
  archive_string_free(&me->fflags_text);
  free(me->dir_info);
  free(me->reg_info);
  free(me);
  return;
}

Assistant:

static void
mtree_entry_free(struct mtree_entry *me)
{
	archive_string_free(&me->parentdir);
	archive_string_free(&me->basename);
	archive_string_free(&me->pathname);
	archive_string_free(&me->symlink);
	archive_string_free(&me->uname);
	archive_string_free(&me->gname);
	archive_string_free(&me->fflags_text);
	free(me->dir_info);
	free(me->reg_info);
	free(me);
}